

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemory(BinaryReader *this,Limits *out_page_limits)

{
  pointer *ppLVar1;
  iterator __position;
  uint64_t uVar2;
  bool bVar3;
  bool bVar4;
  undefined5 uVar5;
  Result RVar6;
  char *format;
  uint8_t flags;
  uint32_t max;
  uint32_t initial;
  byte local_39;
  uint32_t local_38;
  uint local_34;
  
  local_38 = 0;
  RVar6 = ReadU8(this,&local_39,"memory flags");
  if (RVar6.enum_ != Error) {
    if (local_39 < 8) {
      if (((local_39 & 2) == 0) || ((this->options_->features).threads_enabled_ != false)) {
        if (((local_39 & 4) == 0) || ((this->options_->features).memory64_enabled_ != false)) {
          RVar6 = ReadU32Leb128(this,&local_34,"memory initial page count");
          if (RVar6.enum_ == Error) {
            return (Result)Error;
          }
          if (((local_39 & 1) != 0) &&
             (RVar6 = ReadU32Leb128(this,&local_38,"memory max page count"), RVar6.enum_ == Error))
          {
            return (Result)Error;
          }
          out_page_limits->has_max = (bool)(local_39 & 1);
          out_page_limits->is_shared = SUB41((local_39 & 2) >> 1,0);
          out_page_limits->is_64 = SUB41((local_39 & 4) >> 2,0);
          out_page_limits->initial = (ulong)local_34;
          out_page_limits->max = (ulong)local_38;
          __position._M_current =
               (this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::Limits,std::allocator<wabt::Limits>>::
            _M_realloc_insert<wabt::Limits_const&>
                      ((vector<wabt::Limits,std::allocator<wabt::Limits>> *)&this->memories,
                       __position,out_page_limits);
          }
          else {
            bVar3 = out_page_limits->is_shared;
            bVar4 = out_page_limits->is_64;
            uVar5 = *(undefined5 *)&out_page_limits->field_0x13;
            (__position._M_current)->has_max = out_page_limits->has_max;
            (__position._M_current)->is_shared = bVar3;
            (__position._M_current)->is_64 = bVar4;
            *(undefined5 *)&(__position._M_current)->field_0x13 = uVar5;
            uVar2 = out_page_limits->max;
            (__position._M_current)->initial = out_page_limits->initial;
            (__position._M_current)->max = uVar2;
            ppLVar1 = &(this->memories).
                       super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppLVar1 = *ppLVar1 + 1;
          }
          return (Result)Ok;
        }
        format = "memory64 not allowed";
      }
      else {
        format = "memory may not be shared: threads not allowed";
      }
      PrintError(this,format);
    }
    else {
      PrintError(this,"malformed memory limits flag: %d",(ulong)(uint)local_39);
    }
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadMemory(Limits* out_page_limits) {
  uint8_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU8(&flags, "memory flags"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  bool is_64 = flags & WABT_BINARY_LIMITS_IS_64_FLAG;
  const uint8_t unknown_flags = flags & ~WABT_BINARY_LIMITS_ALL_FLAGS;
  ERROR_UNLESS(unknown_flags == 0, "malformed memory limits flag: %d", flags);
  ERROR_IF(is_shared && !options_.features.threads_enabled(),
           "memory may not be shared: threads not allowed");
  ERROR_IF(is_64 && !options_.features.memory64_enabled(),
           "memory64 not allowed");
  CHECK_RESULT(ReadU32Leb128(&initial, "memory initial page count"));
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "memory max page count"));
  }

  out_page_limits->has_max = has_max;
  out_page_limits->is_shared = is_shared;
  out_page_limits->is_64 = is_64;
  out_page_limits->initial = initial;
  out_page_limits->max = max;

  // Have to keep a copy of these, to know how to interpret load/stores.
  memories.push_back(*out_page_limits);
  return Result::Ok;
}